

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF.h
# Opt level: O0

SubChunkHeader Assimp::IFF::LoadSubChunk(uint8_t **outFile)

{
  SubChunkHeader SVar1;
  uint8_t **outFile_local;
  SubChunkHeader head;
  
  outFile_local._0_4_ = *(undefined4 *)*outFile;
  *outFile = *outFile + 4;
  outFile_local._4_2_ = *(undefined2 *)*outFile;
  *outFile = *outFile + 2;
  ByteSwap::Swap2((void *)((long)&outFile_local + 4));
  ByteSwap::Swap4(&outFile_local);
  SVar1.length = outFile_local._4_2_;
  SVar1.type = outFile_local._0_4_;
  SVar1._6_2_ = outFile_local._6_2_;
  return SVar1;
}

Assistant:

inline SubChunkHeader LoadSubChunk(uint8_t*& outFile)
{
    SubChunkHeader head;
    ::memcpy(&head.type, outFile, 4);
    outFile += 4;
    ::memcpy(&head.length, outFile, 2);
    outFile += 2;
    AI_LSWAP2(head.length);
    AI_LSWAP4(head.type);
    return head;
}